

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrapDispatch.h
# Opt level: O1

void __thiscall
vkb::InstanceDispatchTable::InstanceDispatchTable
          (InstanceDispatchTable *this,VkInstance instance,PFN_vkGetInstanceProcAddr procAddr)

{
  PFN_vkDestroyInstance p_Var1;
  PFN_vkEnumeratePhysicalDevices p_Var2;
  PFN_vkGetInstanceProcAddr p_Var3;
  PFN_vkGetPhysicalDeviceProperties p_Var4;
  PFN_vkGetPhysicalDeviceQueueFamilyProperties p_Var5;
  PFN_vkGetPhysicalDeviceMemoryProperties p_Var6;
  PFN_vkGetPhysicalDeviceFeatures p_Var7;
  PFN_vkGetPhysicalDeviceFormatProperties p_Var8;
  PFN_vkGetPhysicalDeviceImageFormatProperties p_Var9;
  PFN_vkEnumerateDeviceLayerProperties p_Var10;
  PFN_vkEnumerateDeviceExtensionProperties p_Var11;
  PFN_vkGetPhysicalDeviceSparseImageFormatProperties p_Var12;
  PFN_vkGetPhysicalDeviceDisplayPropertiesKHR p_Var13;
  PFN_vkGetPhysicalDeviceDisplayPlanePropertiesKHR p_Var14;
  PFN_vkGetDisplayPlaneSupportedDisplaysKHR p_Var15;
  PFN_vkGetDisplayModePropertiesKHR p_Var16;
  PFN_vkCreateDisplayModeKHR p_Var17;
  PFN_vkGetDisplayPlaneCapabilitiesKHR p_Var18;
  PFN_vkCreateDisplayPlaneSurfaceKHR p_Var19;
  PFN_vkDestroySurfaceKHR p_Var20;
  PFN_vkGetPhysicalDeviceSurfaceSupportKHR p_Var21;
  PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR p_Var22;
  PFN_vkGetPhysicalDeviceSurfaceFormatsKHR p_Var23;
  PFN_vkGetPhysicalDeviceSurfacePresentModesKHR p_Var24;
  PFN_vkCreateDebugReportCallbackEXT p_Var25;
  PFN_vkDestroyDebugReportCallbackEXT p_Var26;
  PFN_vkDebugReportMessageEXT p_Var27;
  PFN_vkGetPhysicalDeviceExternalImageFormatPropertiesNV p_Var28;
  PFN_vkGetPhysicalDeviceFeatures2 p_Var29;
  PFN_vkGetPhysicalDeviceProperties2 p_Var30;
  PFN_vkGetPhysicalDeviceFormatProperties2 p_Var31;
  PFN_vkGetPhysicalDeviceImageFormatProperties2 p_Var32;
  PFN_vkGetPhysicalDeviceQueueFamilyProperties2 p_Var33;
  PFN_vkGetPhysicalDeviceMemoryProperties2 p_Var34;
  PFN_vkGetPhysicalDeviceSparseImageFormatProperties2 p_Var35;
  PFN_vkGetPhysicalDeviceExternalBufferProperties p_Var36;
  PFN_vkGetPhysicalDeviceExternalSemaphoreProperties p_Var37;
  PFN_vkGetPhysicalDeviceExternalFenceProperties p_Var38;
  PFN_vkReleaseDisplayEXT p_Var39;
  PFN_vkGetPhysicalDeviceSurfaceCapabilities2EXT p_Var40;
  PFN_vkEnumeratePhysicalDeviceGroups p_Var41;
  PFN_vkGetPhysicalDevicePresentRectanglesKHR p_Var42;
  PFN_vkGetPhysicalDeviceMultisamplePropertiesEXT p_Var43;
  PFN_vkGetPhysicalDeviceSurfaceCapabilities2KHR p_Var44;
  PFN_vkGetPhysicalDeviceSurfaceFormats2KHR p_Var45;
  PFN_vkGetPhysicalDeviceDisplayProperties2KHR p_Var46;
  PFN_vkGetPhysicalDeviceDisplayPlaneProperties2KHR p_Var47;
  PFN_vkGetDisplayModeProperties2KHR p_Var48;
  PFN_vkGetDisplayPlaneCapabilities2KHR p_Var49;
  PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsKHR p_Var50;
  PFN_vkCreateDebugUtilsMessengerEXT p_Var51;
  PFN_vkDestroyDebugUtilsMessengerEXT p_Var52;
  PFN_vkSubmitDebugUtilsMessageEXT p_Var53;
  PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV p_Var54;
  PFN_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR p_Var55;
  PFN_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR p_Var56;
  PFN_vkCreateHeadlessSurfaceEXT p_Var57;
  PFN_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV p_Var58;
  PFN_vkGetPhysicalDeviceToolProperties p_Var59;
  PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR p_Var60;
  PFN_vkGetPhysicalDeviceVideoCapabilitiesKHR p_Var61;
  PFN_vkGetPhysicalDeviceVideoFormatPropertiesKHR p_Var62;
  PFN_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR p_Var63;
  PFN_vkAcquireDrmDisplayEXT p_Var64;
  PFN_vkGetDrmDisplayEXT p_Var65;
  PFN_vkGetPhysicalDeviceOpticalFlowImageFormatsNV p_Var66;
  PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR p_Var67;
  PFN_vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV p_Var68;
  PFN_vkGetPhysicalDeviceCooperativeVectorPropertiesNV p_Var69;
  PFN_vkGetPhysicalDeviceFeatures2KHR p_Var70;
  PFN_vkGetPhysicalDeviceProperties2KHR p_Var71;
  PFN_vkGetPhysicalDeviceFormatProperties2KHR p_Var72;
  PFN_vkGetPhysicalDeviceImageFormatProperties2KHR p_Var73;
  PFN_vkGetPhysicalDeviceQueueFamilyProperties2KHR p_Var74;
  PFN_vkGetPhysicalDeviceMemoryProperties2KHR p_Var75;
  PFN_vkGetPhysicalDeviceSparseImageFormatProperties2KHR p_Var76;
  PFN_vkGetPhysicalDeviceExternalBufferPropertiesKHR p_Var77;
  PFN_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR p_Var78;
  PFN_vkGetPhysicalDeviceExternalFencePropertiesKHR p_Var79;
  PFN_vkEnumeratePhysicalDeviceGroupsKHR p_Var80;
  PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT p_Var81;
  PFN_vkGetPhysicalDeviceToolPropertiesEXT p_Var82;
  
  memset(this,0,0x370);
  this->instance = instance;
  this->populated = true;
  p_Var1 = (PFN_vkDestroyInstance)(*procAddr)(instance,"vkDestroyInstance");
  this->fp_vkDestroyInstance = p_Var1;
  p_Var2 = (PFN_vkEnumeratePhysicalDevices)(*procAddr)(instance,"vkEnumeratePhysicalDevices");
  this->fp_vkEnumeratePhysicalDevices = p_Var2;
  p_Var3 = (PFN_vkGetInstanceProcAddr)(*procAddr)(instance,"vkGetInstanceProcAddr");
  this->fp_vkGetInstanceProcAddr = p_Var3;
  p_Var4 = (PFN_vkGetPhysicalDeviceProperties)(*procAddr)(instance,"vkGetPhysicalDeviceProperties");
  this->fp_vkGetPhysicalDeviceProperties = p_Var4;
  p_Var5 = (PFN_vkGetPhysicalDeviceQueueFamilyProperties)
           (*procAddr)(instance,"vkGetPhysicalDeviceQueueFamilyProperties");
  this->fp_vkGetPhysicalDeviceQueueFamilyProperties = p_Var5;
  p_Var6 = (PFN_vkGetPhysicalDeviceMemoryProperties)
           (*procAddr)(instance,"vkGetPhysicalDeviceMemoryProperties");
  this->fp_vkGetPhysicalDeviceMemoryProperties = p_Var6;
  p_Var7 = (PFN_vkGetPhysicalDeviceFeatures)(*procAddr)(instance,"vkGetPhysicalDeviceFeatures");
  this->fp_vkGetPhysicalDeviceFeatures = p_Var7;
  p_Var8 = (PFN_vkGetPhysicalDeviceFormatProperties)
           (*procAddr)(instance,"vkGetPhysicalDeviceFormatProperties");
  this->fp_vkGetPhysicalDeviceFormatProperties = p_Var8;
  p_Var9 = (PFN_vkGetPhysicalDeviceImageFormatProperties)
           (*procAddr)(instance,"vkGetPhysicalDeviceImageFormatProperties");
  this->fp_vkGetPhysicalDeviceImageFormatProperties = p_Var9;
  p_Var10 = (PFN_vkEnumerateDeviceLayerProperties)
            (*procAddr)(instance,"vkEnumerateDeviceLayerProperties");
  this->fp_vkEnumerateDeviceLayerProperties = p_Var10;
  p_Var11 = (PFN_vkEnumerateDeviceExtensionProperties)
            (*procAddr)(instance,"vkEnumerateDeviceExtensionProperties");
  this->fp_vkEnumerateDeviceExtensionProperties = p_Var11;
  p_Var12 = (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)
            (*procAddr)(instance,"vkGetPhysicalDeviceSparseImageFormatProperties");
  this->fp_vkGetPhysicalDeviceSparseImageFormatProperties = p_Var12;
  p_Var13 = (PFN_vkGetPhysicalDeviceDisplayPropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceDisplayPropertiesKHR");
  this->fp_vkGetPhysicalDeviceDisplayPropertiesKHR = p_Var13;
  p_Var14 = (PFN_vkGetPhysicalDeviceDisplayPlanePropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceDisplayPlanePropertiesKHR");
  this->fp_vkGetPhysicalDeviceDisplayPlanePropertiesKHR = p_Var14;
  p_Var15 = (PFN_vkGetDisplayPlaneSupportedDisplaysKHR)
            (*procAddr)(instance,"vkGetDisplayPlaneSupportedDisplaysKHR");
  this->fp_vkGetDisplayPlaneSupportedDisplaysKHR = p_Var15;
  p_Var16 = (PFN_vkGetDisplayModePropertiesKHR)(*procAddr)(instance,"vkGetDisplayModePropertiesKHR")
  ;
  this->fp_vkGetDisplayModePropertiesKHR = p_Var16;
  p_Var17 = (PFN_vkCreateDisplayModeKHR)(*procAddr)(instance,"vkCreateDisplayModeKHR");
  this->fp_vkCreateDisplayModeKHR = p_Var17;
  p_Var18 = (PFN_vkGetDisplayPlaneCapabilitiesKHR)
            (*procAddr)(instance,"vkGetDisplayPlaneCapabilitiesKHR");
  this->fp_vkGetDisplayPlaneCapabilitiesKHR = p_Var18;
  p_Var19 = (PFN_vkCreateDisplayPlaneSurfaceKHR)
            (*procAddr)(instance,"vkCreateDisplayPlaneSurfaceKHR");
  this->fp_vkCreateDisplayPlaneSurfaceKHR = p_Var19;
  p_Var20 = (PFN_vkDestroySurfaceKHR)(*procAddr)(instance,"vkDestroySurfaceKHR");
  this->fp_vkDestroySurfaceKHR = p_Var20;
  p_Var21 = (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfaceSupportKHR");
  this->fp_vkGetPhysicalDeviceSurfaceSupportKHR = p_Var21;
  p_Var22 = (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
  this->fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR = p_Var22;
  p_Var23 = (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfaceFormatsKHR");
  this->fp_vkGetPhysicalDeviceSurfaceFormatsKHR = p_Var23;
  p_Var24 = (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfacePresentModesKHR");
  this->fp_vkGetPhysicalDeviceSurfacePresentModesKHR = p_Var24;
  p_Var25 = (PFN_vkCreateDebugReportCallbackEXT)
            (*procAddr)(instance,"vkCreateDebugReportCallbackEXT");
  this->fp_vkCreateDebugReportCallbackEXT = p_Var25;
  p_Var26 = (PFN_vkDestroyDebugReportCallbackEXT)
            (*procAddr)(instance,"vkDestroyDebugReportCallbackEXT");
  this->fp_vkDestroyDebugReportCallbackEXT = p_Var26;
  p_Var27 = (PFN_vkDebugReportMessageEXT)(*procAddr)(instance,"vkDebugReportMessageEXT");
  this->fp_vkDebugReportMessageEXT = p_Var27;
  p_Var28 = (PFN_vkGetPhysicalDeviceExternalImageFormatPropertiesNV)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalImageFormatPropertiesNV");
  this->fp_vkGetPhysicalDeviceExternalImageFormatPropertiesNV = p_Var28;
  p_Var29 = (PFN_vkGetPhysicalDeviceFeatures2)(*procAddr)(instance,"vkGetPhysicalDeviceFeatures2");
  this->fp_vkGetPhysicalDeviceFeatures2 = p_Var29;
  p_Var30 = (PFN_vkGetPhysicalDeviceProperties2)
            (*procAddr)(instance,"vkGetPhysicalDeviceProperties2");
  this->fp_vkGetPhysicalDeviceProperties2 = p_Var30;
  p_Var31 = (PFN_vkGetPhysicalDeviceFormatProperties2)
            (*procAddr)(instance,"vkGetPhysicalDeviceFormatProperties2");
  this->fp_vkGetPhysicalDeviceFormatProperties2 = p_Var31;
  p_Var32 = (PFN_vkGetPhysicalDeviceImageFormatProperties2)
            (*procAddr)(instance,"vkGetPhysicalDeviceImageFormatProperties2");
  this->fp_vkGetPhysicalDeviceImageFormatProperties2 = p_Var32;
  p_Var33 = (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)
            (*procAddr)(instance,"vkGetPhysicalDeviceQueueFamilyProperties2");
  this->fp_vkGetPhysicalDeviceQueueFamilyProperties2 = p_Var33;
  p_Var34 = (PFN_vkGetPhysicalDeviceMemoryProperties2)
            (*procAddr)(instance,"vkGetPhysicalDeviceMemoryProperties2");
  this->fp_vkGetPhysicalDeviceMemoryProperties2 = p_Var34;
  p_Var35 = (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)
            (*procAddr)(instance,"vkGetPhysicalDeviceSparseImageFormatProperties2");
  this->fp_vkGetPhysicalDeviceSparseImageFormatProperties2 = p_Var35;
  p_Var36 = (PFN_vkGetPhysicalDeviceExternalBufferProperties)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalBufferProperties");
  this->fp_vkGetPhysicalDeviceExternalBufferProperties = p_Var36;
  p_Var37 = (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalSemaphoreProperties");
  this->fp_vkGetPhysicalDeviceExternalSemaphoreProperties = p_Var37;
  p_Var38 = (PFN_vkGetPhysicalDeviceExternalFenceProperties)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalFenceProperties");
  this->fp_vkGetPhysicalDeviceExternalFenceProperties = p_Var38;
  p_Var39 = (PFN_vkReleaseDisplayEXT)(*procAddr)(instance,"vkReleaseDisplayEXT");
  this->fp_vkReleaseDisplayEXT = p_Var39;
  p_Var40 = (PFN_vkGetPhysicalDeviceSurfaceCapabilities2EXT)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfaceCapabilities2EXT");
  this->fp_vkGetPhysicalDeviceSurfaceCapabilities2EXT = p_Var40;
  p_Var41 = (PFN_vkEnumeratePhysicalDeviceGroups)
            (*procAddr)(instance,"vkEnumeratePhysicalDeviceGroups");
  this->fp_vkEnumeratePhysicalDeviceGroups = p_Var41;
  p_Var42 = (PFN_vkGetPhysicalDevicePresentRectanglesKHR)
            (*procAddr)(instance,"vkGetPhysicalDevicePresentRectanglesKHR");
  this->fp_vkGetPhysicalDevicePresentRectanglesKHR = p_Var42;
  p_Var43 = (PFN_vkGetPhysicalDeviceMultisamplePropertiesEXT)
            (*procAddr)(instance,"vkGetPhysicalDeviceMultisamplePropertiesEXT");
  this->fp_vkGetPhysicalDeviceMultisamplePropertiesEXT = p_Var43;
  p_Var44 = (PFN_vkGetPhysicalDeviceSurfaceCapabilities2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfaceCapabilities2KHR");
  this->fp_vkGetPhysicalDeviceSurfaceCapabilities2KHR = p_Var44;
  p_Var45 = (PFN_vkGetPhysicalDeviceSurfaceFormats2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSurfaceFormats2KHR");
  this->fp_vkGetPhysicalDeviceSurfaceFormats2KHR = p_Var45;
  p_Var46 = (PFN_vkGetPhysicalDeviceDisplayProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceDisplayProperties2KHR");
  this->fp_vkGetPhysicalDeviceDisplayProperties2KHR = p_Var46;
  p_Var47 = (PFN_vkGetPhysicalDeviceDisplayPlaneProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceDisplayPlaneProperties2KHR");
  this->fp_vkGetPhysicalDeviceDisplayPlaneProperties2KHR = p_Var47;
  p_Var48 = (PFN_vkGetDisplayModeProperties2KHR)
            (*procAddr)(instance,"vkGetDisplayModeProperties2KHR");
  this->fp_vkGetDisplayModeProperties2KHR = p_Var48;
  p_Var49 = (PFN_vkGetDisplayPlaneCapabilities2KHR)
            (*procAddr)(instance,"vkGetDisplayPlaneCapabilities2KHR");
  this->fp_vkGetDisplayPlaneCapabilities2KHR = p_Var49;
  p_Var50 = (PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceCalibrateableTimeDomainsKHR");
  this->fp_vkGetPhysicalDeviceCalibrateableTimeDomainsKHR = p_Var50;
  p_Var51 = (PFN_vkCreateDebugUtilsMessengerEXT)
            (*procAddr)(instance,"vkCreateDebugUtilsMessengerEXT");
  this->fp_vkCreateDebugUtilsMessengerEXT = p_Var51;
  p_Var52 = (PFN_vkDestroyDebugUtilsMessengerEXT)
            (*procAddr)(instance,"vkDestroyDebugUtilsMessengerEXT");
  this->fp_vkDestroyDebugUtilsMessengerEXT = p_Var52;
  p_Var53 = (PFN_vkSubmitDebugUtilsMessageEXT)(*procAddr)(instance,"vkSubmitDebugUtilsMessageEXT");
  this->fp_vkSubmitDebugUtilsMessageEXT = p_Var53;
  p_Var54 = (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV)
            (*procAddr)(instance,"vkGetPhysicalDeviceCooperativeMatrixPropertiesNV");
  this->fp_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV = p_Var54;
  p_Var55 = (PFN_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR)
            (*procAddr)(instance,"vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR");
  this->fp_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR = p_Var55;
  p_Var56 = (PFN_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR");
  this->fp_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR = p_Var56;
  p_Var57 = (PFN_vkCreateHeadlessSurfaceEXT)(*procAddr)(instance,"vkCreateHeadlessSurfaceEXT");
  this->fp_vkCreateHeadlessSurfaceEXT = p_Var57;
  p_Var58 = (PFN_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV)
            (*procAddr)(instance,"vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV"
                       );
  this->fp_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV = p_Var58;
  p_Var59 = (PFN_vkGetPhysicalDeviceToolProperties)
            (*procAddr)(instance,"vkGetPhysicalDeviceToolProperties");
  this->fp_vkGetPhysicalDeviceToolProperties = p_Var59;
  p_Var60 = (PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceFragmentShadingRatesKHR");
  this->fp_vkGetPhysicalDeviceFragmentShadingRatesKHR = p_Var60;
  p_Var61 = (PFN_vkGetPhysicalDeviceVideoCapabilitiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceVideoCapabilitiesKHR");
  this->fp_vkGetPhysicalDeviceVideoCapabilitiesKHR = p_Var61;
  p_Var62 = (PFN_vkGetPhysicalDeviceVideoFormatPropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceVideoFormatPropertiesKHR");
  this->fp_vkGetPhysicalDeviceVideoFormatPropertiesKHR = p_Var62;
  p_Var63 = (PFN_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR");
  this->fp_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR = p_Var63;
  p_Var64 = (PFN_vkAcquireDrmDisplayEXT)(*procAddr)(instance,"vkAcquireDrmDisplayEXT");
  this->fp_vkAcquireDrmDisplayEXT = p_Var64;
  p_Var65 = (PFN_vkGetDrmDisplayEXT)(*procAddr)(instance,"vkGetDrmDisplayEXT");
  this->fp_vkGetDrmDisplayEXT = p_Var65;
  p_Var66 = (PFN_vkGetPhysicalDeviceOpticalFlowImageFormatsNV)
            (*procAddr)(instance,"vkGetPhysicalDeviceOpticalFlowImageFormatsNV");
  this->fp_vkGetPhysicalDeviceOpticalFlowImageFormatsNV = p_Var66;
  p_Var67 = (PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR");
  this->fp_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR = p_Var67;
  p_Var68 = (PFN_vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV)
            (*procAddr)(instance,
                        "vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV");
  this->fp_vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV = p_Var68;
  p_Var69 = (PFN_vkGetPhysicalDeviceCooperativeVectorPropertiesNV)
            (*procAddr)(instance,"vkGetPhysicalDeviceCooperativeVectorPropertiesNV");
  this->fp_vkGetPhysicalDeviceCooperativeVectorPropertiesNV = p_Var69;
  p_Var70 = (PFN_vkGetPhysicalDeviceFeatures2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceFeatures2KHR");
  this->fp_vkGetPhysicalDeviceFeatures2KHR = p_Var70;
  p_Var71 = (PFN_vkGetPhysicalDeviceProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceProperties2KHR");
  this->fp_vkGetPhysicalDeviceProperties2KHR = p_Var71;
  p_Var72 = (PFN_vkGetPhysicalDeviceFormatProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceFormatProperties2KHR");
  this->fp_vkGetPhysicalDeviceFormatProperties2KHR = p_Var72;
  p_Var73 = (PFN_vkGetPhysicalDeviceImageFormatProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceImageFormatProperties2KHR");
  this->fp_vkGetPhysicalDeviceImageFormatProperties2KHR = p_Var73;
  p_Var74 = (PFN_vkGetPhysicalDeviceQueueFamilyProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceQueueFamilyProperties2KHR");
  this->fp_vkGetPhysicalDeviceQueueFamilyProperties2KHR = p_Var74;
  p_Var75 = (PFN_vkGetPhysicalDeviceMemoryProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceMemoryProperties2KHR");
  this->fp_vkGetPhysicalDeviceMemoryProperties2KHR = p_Var75;
  p_Var76 = (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2KHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceSparseImageFormatProperties2KHR");
  this->fp_vkGetPhysicalDeviceSparseImageFormatProperties2KHR = p_Var76;
  p_Var77 = (PFN_vkGetPhysicalDeviceExternalBufferPropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalBufferPropertiesKHR");
  this->fp_vkGetPhysicalDeviceExternalBufferPropertiesKHR = p_Var77;
  p_Var78 = (PFN_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalSemaphorePropertiesKHR");
  this->fp_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR = p_Var78;
  p_Var79 = (PFN_vkGetPhysicalDeviceExternalFencePropertiesKHR)
            (*procAddr)(instance,"vkGetPhysicalDeviceExternalFencePropertiesKHR");
  this->fp_vkGetPhysicalDeviceExternalFencePropertiesKHR = p_Var79;
  p_Var80 = (PFN_vkEnumeratePhysicalDeviceGroupsKHR)
            (*procAddr)(instance,"vkEnumeratePhysicalDeviceGroupsKHR");
  this->fp_vkEnumeratePhysicalDeviceGroupsKHR = p_Var80;
  p_Var81 = (PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT)
            (*procAddr)(instance,"vkGetPhysicalDeviceCalibrateableTimeDomainsEXT");
  this->fp_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT = p_Var81;
  p_Var82 = (PFN_vkGetPhysicalDeviceToolPropertiesEXT)
            (*procAddr)(instance,"vkGetPhysicalDeviceToolPropertiesEXT");
  this->fp_vkGetPhysicalDeviceToolPropertiesEXT = p_Var82;
  return;
}

Assistant:

InstanceDispatchTable(VkInstance instance, PFN_vkGetInstanceProcAddr procAddr) : instance(instance), populated(true) {
        fp_vkDestroyInstance = reinterpret_cast<PFN_vkDestroyInstance>(procAddr(instance, "vkDestroyInstance"));
        fp_vkEnumeratePhysicalDevices = reinterpret_cast<PFN_vkEnumeratePhysicalDevices>(procAddr(instance, "vkEnumeratePhysicalDevices"));
        fp_vkGetInstanceProcAddr = reinterpret_cast<PFN_vkGetInstanceProcAddr>(procAddr(instance, "vkGetInstanceProcAddr"));
        fp_vkGetPhysicalDeviceProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceProperties>(procAddr(instance, "vkGetPhysicalDeviceProperties"));
        fp_vkGetPhysicalDeviceQueueFamilyProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceQueueFamilyProperties>(procAddr(instance, "vkGetPhysicalDeviceQueueFamilyProperties"));
        fp_vkGetPhysicalDeviceMemoryProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceMemoryProperties>(procAddr(instance, "vkGetPhysicalDeviceMemoryProperties"));
        fp_vkGetPhysicalDeviceFeatures = reinterpret_cast<PFN_vkGetPhysicalDeviceFeatures>(procAddr(instance, "vkGetPhysicalDeviceFeatures"));
        fp_vkGetPhysicalDeviceFormatProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceFormatProperties>(procAddr(instance, "vkGetPhysicalDeviceFormatProperties"));
        fp_vkGetPhysicalDeviceImageFormatProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceImageFormatProperties>(procAddr(instance, "vkGetPhysicalDeviceImageFormatProperties"));
        fp_vkEnumerateDeviceLayerProperties = reinterpret_cast<PFN_vkEnumerateDeviceLayerProperties>(procAddr(instance, "vkEnumerateDeviceLayerProperties"));
        fp_vkEnumerateDeviceExtensionProperties = reinterpret_cast<PFN_vkEnumerateDeviceExtensionProperties>(procAddr(instance, "vkEnumerateDeviceExtensionProperties"));
        fp_vkGetPhysicalDeviceSparseImageFormatProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceSparseImageFormatProperties>(procAddr(instance, "vkGetPhysicalDeviceSparseImageFormatProperties"));
#if (defined(VK_KHR_android_surface))
        fp_vkCreateAndroidSurfaceKHR = reinterpret_cast<PFN_vkCreateAndroidSurfaceKHR>(procAddr(instance, "vkCreateAndroidSurfaceKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkGetPhysicalDeviceDisplayPropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceDisplayPropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceDisplayPropertiesKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkGetPhysicalDeviceDisplayPlanePropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceDisplayPlanePropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceDisplayPlanePropertiesKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkGetDisplayPlaneSupportedDisplaysKHR = reinterpret_cast<PFN_vkGetDisplayPlaneSupportedDisplaysKHR>(procAddr(instance, "vkGetDisplayPlaneSupportedDisplaysKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkGetDisplayModePropertiesKHR = reinterpret_cast<PFN_vkGetDisplayModePropertiesKHR>(procAddr(instance, "vkGetDisplayModePropertiesKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkCreateDisplayModeKHR = reinterpret_cast<PFN_vkCreateDisplayModeKHR>(procAddr(instance, "vkCreateDisplayModeKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkGetDisplayPlaneCapabilitiesKHR = reinterpret_cast<PFN_vkGetDisplayPlaneCapabilitiesKHR>(procAddr(instance, "vkGetDisplayPlaneCapabilitiesKHR"));
#endif
#if (defined(VK_KHR_display))
        fp_vkCreateDisplayPlaneSurfaceKHR = reinterpret_cast<PFN_vkCreateDisplayPlaneSurfaceKHR>(procAddr(instance, "vkCreateDisplayPlaneSurfaceKHR"));
#endif
#if (defined(VK_KHR_surface))
        fp_vkDestroySurfaceKHR = reinterpret_cast<PFN_vkDestroySurfaceKHR>(procAddr(instance, "vkDestroySurfaceKHR"));
#endif
#if (defined(VK_KHR_surface))
        fp_vkGetPhysicalDeviceSurfaceSupportKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfaceSupportKHR>(procAddr(instance, "vkGetPhysicalDeviceSurfaceSupportKHR"));
#endif
#if (defined(VK_KHR_surface))
        fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR>(procAddr(instance, "vkGetPhysicalDeviceSurfaceCapabilitiesKHR"));
#endif
#if (defined(VK_KHR_surface))
        fp_vkGetPhysicalDeviceSurfaceFormatsKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfaceFormatsKHR>(procAddr(instance, "vkGetPhysicalDeviceSurfaceFormatsKHR"));
#endif
#if (defined(VK_KHR_surface))
        fp_vkGetPhysicalDeviceSurfacePresentModesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfacePresentModesKHR>(procAddr(instance, "vkGetPhysicalDeviceSurfacePresentModesKHR"));
#endif
#if (defined(VK_NN_vi_surface))
        fp_vkCreateViSurfaceNN = reinterpret_cast<PFN_vkCreateViSurfaceNN>(procAddr(instance, "vkCreateViSurfaceNN"));
#endif
#if (defined(VK_KHR_wayland_surface))
        fp_vkCreateWaylandSurfaceKHR = reinterpret_cast<PFN_vkCreateWaylandSurfaceKHR>(procAddr(instance, "vkCreateWaylandSurfaceKHR"));
#endif
#if (defined(VK_KHR_wayland_surface))
        fp_vkGetPhysicalDeviceWaylandPresentationSupportKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceWaylandPresentationSupportKHR>(procAddr(instance, "vkGetPhysicalDeviceWaylandPresentationSupportKHR"));
#endif
#if (defined(VK_KHR_win32_surface))
        fp_vkCreateWin32SurfaceKHR = reinterpret_cast<PFN_vkCreateWin32SurfaceKHR>(procAddr(instance, "vkCreateWin32SurfaceKHR"));
#endif
#if (defined(VK_KHR_win32_surface))
        fp_vkGetPhysicalDeviceWin32PresentationSupportKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceWin32PresentationSupportKHR>(procAddr(instance, "vkGetPhysicalDeviceWin32PresentationSupportKHR"));
#endif
#if (defined(VK_KHR_xlib_surface))
        fp_vkCreateXlibSurfaceKHR = reinterpret_cast<PFN_vkCreateXlibSurfaceKHR>(procAddr(instance, "vkCreateXlibSurfaceKHR"));
#endif
#if (defined(VK_KHR_xlib_surface))
        fp_vkGetPhysicalDeviceXlibPresentationSupportKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceXlibPresentationSupportKHR>(procAddr(instance, "vkGetPhysicalDeviceXlibPresentationSupportKHR"));
#endif
#if (defined(VK_KHR_xcb_surface))
        fp_vkCreateXcbSurfaceKHR = reinterpret_cast<PFN_vkCreateXcbSurfaceKHR>(procAddr(instance, "vkCreateXcbSurfaceKHR"));
#endif
#if (defined(VK_KHR_xcb_surface))
        fp_vkGetPhysicalDeviceXcbPresentationSupportKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceXcbPresentationSupportKHR>(procAddr(instance, "vkGetPhysicalDeviceXcbPresentationSupportKHR"));
#endif
#if (defined(VK_EXT_directfb_surface))
        fp_vkCreateDirectFBSurfaceEXT = reinterpret_cast<PFN_vkCreateDirectFBSurfaceEXT>(procAddr(instance, "vkCreateDirectFBSurfaceEXT"));
#endif
#if (defined(VK_EXT_directfb_surface))
        fp_vkGetPhysicalDeviceDirectFBPresentationSupportEXT = reinterpret_cast<PFN_vkGetPhysicalDeviceDirectFBPresentationSupportEXT>(procAddr(instance, "vkGetPhysicalDeviceDirectFBPresentationSupportEXT"));
#endif
#if (defined(VK_FUCHSIA_imagepipe_surface))
        fp_vkCreateImagePipeSurfaceFUCHSIA = reinterpret_cast<PFN_vkCreateImagePipeSurfaceFUCHSIA>(procAddr(instance, "vkCreateImagePipeSurfaceFUCHSIA"));
#endif
#if (defined(VK_GGP_stream_descriptor_surface))
        fp_vkCreateStreamDescriptorSurfaceGGP = reinterpret_cast<PFN_vkCreateStreamDescriptorSurfaceGGP>(procAddr(instance, "vkCreateStreamDescriptorSurfaceGGP"));
#endif
#if (defined(VK_QNX_screen_surface))
        fp_vkCreateScreenSurfaceQNX = reinterpret_cast<PFN_vkCreateScreenSurfaceQNX>(procAddr(instance, "vkCreateScreenSurfaceQNX"));
#endif
#if (defined(VK_QNX_screen_surface))
        fp_vkGetPhysicalDeviceScreenPresentationSupportQNX = reinterpret_cast<PFN_vkGetPhysicalDeviceScreenPresentationSupportQNX>(procAddr(instance, "vkGetPhysicalDeviceScreenPresentationSupportQNX"));
#endif
#if (defined(VK_EXT_debug_report))
        fp_vkCreateDebugReportCallbackEXT = reinterpret_cast<PFN_vkCreateDebugReportCallbackEXT>(procAddr(instance, "vkCreateDebugReportCallbackEXT"));
#endif
#if (defined(VK_EXT_debug_report))
        fp_vkDestroyDebugReportCallbackEXT = reinterpret_cast<PFN_vkDestroyDebugReportCallbackEXT>(procAddr(instance, "vkDestroyDebugReportCallbackEXT"));
#endif
#if (defined(VK_EXT_debug_report))
        fp_vkDebugReportMessageEXT = reinterpret_cast<PFN_vkDebugReportMessageEXT>(procAddr(instance, "vkDebugReportMessageEXT"));
#endif
#if (defined(VK_NV_external_memory_capabilities))
        fp_vkGetPhysicalDeviceExternalImageFormatPropertiesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalImageFormatPropertiesNV>(procAddr(instance, "vkGetPhysicalDeviceExternalImageFormatPropertiesNV"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceFeatures2 = reinterpret_cast<PFN_vkGetPhysicalDeviceFeatures2>(procAddr(instance, "vkGetPhysicalDeviceFeatures2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceProperties2 = reinterpret_cast<PFN_vkGetPhysicalDeviceProperties2>(procAddr(instance, "vkGetPhysicalDeviceProperties2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceFormatProperties2 = reinterpret_cast<PFN_vkGetPhysicalDeviceFormatProperties2>(procAddr(instance, "vkGetPhysicalDeviceFormatProperties2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceImageFormatProperties2 = reinterpret_cast<PFN_vkGetPhysicalDeviceImageFormatProperties2>(procAddr(instance, "vkGetPhysicalDeviceImageFormatProperties2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceQueueFamilyProperties2 = reinterpret_cast<PFN_vkGetPhysicalDeviceQueueFamilyProperties2>(procAddr(instance, "vkGetPhysicalDeviceQueueFamilyProperties2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceMemoryProperties2 = reinterpret_cast<PFN_vkGetPhysicalDeviceMemoryProperties2>(procAddr(instance, "vkGetPhysicalDeviceMemoryProperties2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceSparseImageFormatProperties2 = reinterpret_cast<PFN_vkGetPhysicalDeviceSparseImageFormatProperties2>(procAddr(instance, "vkGetPhysicalDeviceSparseImageFormatProperties2"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceExternalBufferProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalBufferProperties>(procAddr(instance, "vkGetPhysicalDeviceExternalBufferProperties"));
#endif
#if (defined(VK_NV_external_memory_sci_buf))
        fp_vkGetPhysicalDeviceExternalMemorySciBufPropertiesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalMemorySciBufPropertiesNV>(procAddr(instance, "vkGetPhysicalDeviceExternalMemorySciBufPropertiesNV"));
#endif
#if (defined(VK_NV_external_memory_sci_buf))
        fp_vkGetPhysicalDeviceSciBufAttributesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceSciBufAttributesNV>(procAddr(instance, "vkGetPhysicalDeviceSciBufAttributesNV"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceExternalSemaphoreProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalSemaphoreProperties>(procAddr(instance, "vkGetPhysicalDeviceExternalSemaphoreProperties"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkGetPhysicalDeviceExternalFenceProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalFenceProperties>(procAddr(instance, "vkGetPhysicalDeviceExternalFenceProperties"));
#endif
#if (defined(VK_NV_external_sci_sync)) || (defined(VK_NV_external_sci_sync2))
        fp_vkGetPhysicalDeviceSciSyncAttributesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceSciSyncAttributesNV>(procAddr(instance, "vkGetPhysicalDeviceSciSyncAttributesNV"));
#endif
#if (defined(VK_EXT_direct_mode_display))
        fp_vkReleaseDisplayEXT = reinterpret_cast<PFN_vkReleaseDisplayEXT>(procAddr(instance, "vkReleaseDisplayEXT"));
#endif
#if (defined(VK_EXT_acquire_xlib_display))
        fp_vkAcquireXlibDisplayEXT = reinterpret_cast<PFN_vkAcquireXlibDisplayEXT>(procAddr(instance, "vkAcquireXlibDisplayEXT"));
#endif
#if (defined(VK_EXT_acquire_xlib_display))
        fp_vkGetRandROutputDisplayEXT = reinterpret_cast<PFN_vkGetRandROutputDisplayEXT>(procAddr(instance, "vkGetRandROutputDisplayEXT"));
#endif
#if (defined(VK_NV_acquire_winrt_display))
        fp_vkAcquireWinrtDisplayNV = reinterpret_cast<PFN_vkAcquireWinrtDisplayNV>(procAddr(instance, "vkAcquireWinrtDisplayNV"));
#endif
#if (defined(VK_NV_acquire_winrt_display))
        fp_vkGetWinrtDisplayNV = reinterpret_cast<PFN_vkGetWinrtDisplayNV>(procAddr(instance, "vkGetWinrtDisplayNV"));
#endif
#if (defined(VK_EXT_display_surface_counter))
        fp_vkGetPhysicalDeviceSurfaceCapabilities2EXT = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfaceCapabilities2EXT>(procAddr(instance, "vkGetPhysicalDeviceSurfaceCapabilities2EXT"));
#endif
#if (defined(VK_VERSION_1_1))
        fp_vkEnumeratePhysicalDeviceGroups = reinterpret_cast<PFN_vkEnumeratePhysicalDeviceGroups>(procAddr(instance, "vkEnumeratePhysicalDeviceGroups"));
#endif
#if (defined(VK_KHR_swapchain) && defined(VK_VERSION_1_1)) || (defined(VK_KHR_device_group) && defined(VK_KHR_surface))
        fp_vkGetPhysicalDevicePresentRectanglesKHR = reinterpret_cast<PFN_vkGetPhysicalDevicePresentRectanglesKHR>(procAddr(instance, "vkGetPhysicalDevicePresentRectanglesKHR"));
#endif
#if (defined(VK_MVK_ios_surface))
        fp_vkCreateIOSSurfaceMVK = reinterpret_cast<PFN_vkCreateIOSSurfaceMVK>(procAddr(instance, "vkCreateIOSSurfaceMVK"));
#endif
#if (defined(VK_MVK_macos_surface))
        fp_vkCreateMacOSSurfaceMVK = reinterpret_cast<PFN_vkCreateMacOSSurfaceMVK>(procAddr(instance, "vkCreateMacOSSurfaceMVK"));
#endif
#if (defined(VK_EXT_metal_surface))
        fp_vkCreateMetalSurfaceEXT = reinterpret_cast<PFN_vkCreateMetalSurfaceEXT>(procAddr(instance, "vkCreateMetalSurfaceEXT"));
#endif
#if (defined(VK_EXT_sample_locations))
        fp_vkGetPhysicalDeviceMultisamplePropertiesEXT = reinterpret_cast<PFN_vkGetPhysicalDeviceMultisamplePropertiesEXT>(procAddr(instance, "vkGetPhysicalDeviceMultisamplePropertiesEXT"));
#endif
#if (defined(VK_KHR_get_surface_capabilities2))
        fp_vkGetPhysicalDeviceSurfaceCapabilities2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfaceCapabilities2KHR>(procAddr(instance, "vkGetPhysicalDeviceSurfaceCapabilities2KHR"));
#endif
#if (defined(VK_KHR_get_surface_capabilities2))
        fp_vkGetPhysicalDeviceSurfaceFormats2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfaceFormats2KHR>(procAddr(instance, "vkGetPhysicalDeviceSurfaceFormats2KHR"));
#endif
#if (defined(VK_KHR_get_display_properties2))
        fp_vkGetPhysicalDeviceDisplayProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceDisplayProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceDisplayProperties2KHR"));
#endif
#if (defined(VK_KHR_get_display_properties2))
        fp_vkGetPhysicalDeviceDisplayPlaneProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceDisplayPlaneProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceDisplayPlaneProperties2KHR"));
#endif
#if (defined(VK_KHR_get_display_properties2))
        fp_vkGetDisplayModeProperties2KHR = reinterpret_cast<PFN_vkGetDisplayModeProperties2KHR>(procAddr(instance, "vkGetDisplayModeProperties2KHR"));
#endif
#if (defined(VK_KHR_get_display_properties2))
        fp_vkGetDisplayPlaneCapabilities2KHR = reinterpret_cast<PFN_vkGetDisplayPlaneCapabilities2KHR>(procAddr(instance, "vkGetDisplayPlaneCapabilities2KHR"));
#endif
#if (defined(VK_KHR_calibrated_timestamps))
        fp_vkGetPhysicalDeviceCalibrateableTimeDomainsKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsKHR>(procAddr(instance, "vkGetPhysicalDeviceCalibrateableTimeDomainsKHR"));
#endif
#if (defined(VK_EXT_debug_utils))
        fp_vkCreateDebugUtilsMessengerEXT = reinterpret_cast<PFN_vkCreateDebugUtilsMessengerEXT>(procAddr(instance, "vkCreateDebugUtilsMessengerEXT"));
#endif
#if (defined(VK_EXT_debug_utils))
        fp_vkDestroyDebugUtilsMessengerEXT = reinterpret_cast<PFN_vkDestroyDebugUtilsMessengerEXT>(procAddr(instance, "vkDestroyDebugUtilsMessengerEXT"));
#endif
#if (defined(VK_EXT_debug_utils))
        fp_vkSubmitDebugUtilsMessageEXT = reinterpret_cast<PFN_vkSubmitDebugUtilsMessageEXT>(procAddr(instance, "vkSubmitDebugUtilsMessageEXT"));
#endif
#if (defined(VK_NV_cooperative_matrix))
        fp_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesNV>(procAddr(instance, "vkGetPhysicalDeviceCooperativeMatrixPropertiesNV"));
#endif
#if (defined(VK_EXT_full_screen_exclusive))
        fp_vkGetPhysicalDeviceSurfacePresentModes2EXT = reinterpret_cast<PFN_vkGetPhysicalDeviceSurfacePresentModes2EXT>(procAddr(instance, "vkGetPhysicalDeviceSurfacePresentModes2EXT"));
#endif
#if (defined(VK_KHR_performance_query))
        fp_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR = reinterpret_cast<PFN_vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR>(procAddr(instance, "vkEnumeratePhysicalDeviceQueueFamilyPerformanceQueryCountersKHR"));
#endif
#if (defined(VK_KHR_performance_query))
        fp_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR>(procAddr(instance, "vkGetPhysicalDeviceQueueFamilyPerformanceQueryPassesKHR"));
#endif
#if (defined(VK_EXT_headless_surface))
        fp_vkCreateHeadlessSurfaceEXT = reinterpret_cast<PFN_vkCreateHeadlessSurfaceEXT>(procAddr(instance, "vkCreateHeadlessSurfaceEXT"));
#endif
#if (defined(VK_NV_coverage_reduction_mode))
        fp_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV = reinterpret_cast<PFN_vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV>(procAddr(instance, "vkGetPhysicalDeviceSupportedFramebufferMixedSamplesCombinationsNV"));
#endif
#if (defined(VK_VERSION_1_3))
        fp_vkGetPhysicalDeviceToolProperties = reinterpret_cast<PFN_vkGetPhysicalDeviceToolProperties>(procAddr(instance, "vkGetPhysicalDeviceToolProperties"));
#endif
#if (defined(VK_KHR_object_refresh))
        fp_vkGetPhysicalDeviceRefreshableObjectTypesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceRefreshableObjectTypesKHR>(procAddr(instance, "vkGetPhysicalDeviceRefreshableObjectTypesKHR"));
#endif
#if (defined(VK_KHR_fragment_shading_rate))
        fp_vkGetPhysicalDeviceFragmentShadingRatesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceFragmentShadingRatesKHR>(procAddr(instance, "vkGetPhysicalDeviceFragmentShadingRatesKHR"));
#endif
#if (defined(VK_KHR_video_queue))
        fp_vkGetPhysicalDeviceVideoCapabilitiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceVideoCapabilitiesKHR>(procAddr(instance, "vkGetPhysicalDeviceVideoCapabilitiesKHR"));
#endif
#if (defined(VK_KHR_video_queue))
        fp_vkGetPhysicalDeviceVideoFormatPropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceVideoFormatPropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceVideoFormatPropertiesKHR"));
#endif
#if (defined(VK_KHR_video_encode_queue))
        fp_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceVideoEncodeQualityLevelPropertiesKHR"));
#endif
#if (defined(VK_EXT_acquire_drm_display))
        fp_vkAcquireDrmDisplayEXT = reinterpret_cast<PFN_vkAcquireDrmDisplayEXT>(procAddr(instance, "vkAcquireDrmDisplayEXT"));
#endif
#if (defined(VK_EXT_acquire_drm_display))
        fp_vkGetDrmDisplayEXT = reinterpret_cast<PFN_vkGetDrmDisplayEXT>(procAddr(instance, "vkGetDrmDisplayEXT"));
#endif
#if (defined(VK_NV_optical_flow))
        fp_vkGetPhysicalDeviceOpticalFlowImageFormatsNV = reinterpret_cast<PFN_vkGetPhysicalDeviceOpticalFlowImageFormatsNV>(procAddr(instance, "vkGetPhysicalDeviceOpticalFlowImageFormatsNV"));
#endif
#if (defined(VK_KHR_cooperative_matrix))
        fp_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceCooperativeMatrixPropertiesKHR"));
#endif
#if (defined(VK_NV_cooperative_matrix2))
        fp_vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV>(procAddr(instance, "vkGetPhysicalDeviceCooperativeMatrixFlexibleDimensionsPropertiesNV"));
#endif
#if (defined(VK_NV_cooperative_vector))
        fp_vkGetPhysicalDeviceCooperativeVectorPropertiesNV = reinterpret_cast<PFN_vkGetPhysicalDeviceCooperativeVectorPropertiesNV>(procAddr(instance, "vkGetPhysicalDeviceCooperativeVectorPropertiesNV"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceFeatures2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceFeatures2KHR>(procAddr(instance, "vkGetPhysicalDeviceFeatures2KHR"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceProperties2KHR"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceFormatProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceFormatProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceFormatProperties2KHR"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceImageFormatProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceImageFormatProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceImageFormatProperties2KHR"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceQueueFamilyProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceQueueFamilyProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceQueueFamilyProperties2KHR"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceMemoryProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceMemoryProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceMemoryProperties2KHR"));
#endif
#if (defined(VK_KHR_get_physical_device_properties2))
        fp_vkGetPhysicalDeviceSparseImageFormatProperties2KHR = reinterpret_cast<PFN_vkGetPhysicalDeviceSparseImageFormatProperties2KHR>(procAddr(instance, "vkGetPhysicalDeviceSparseImageFormatProperties2KHR"));
#endif
#if (defined(VK_KHR_external_memory_capabilities))
        fp_vkGetPhysicalDeviceExternalBufferPropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalBufferPropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceExternalBufferPropertiesKHR"));
#endif
#if (defined(VK_KHR_external_semaphore_capabilities))
        fp_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalSemaphorePropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceExternalSemaphorePropertiesKHR"));
#endif
#if (defined(VK_KHR_external_fence_capabilities))
        fp_vkGetPhysicalDeviceExternalFencePropertiesKHR = reinterpret_cast<PFN_vkGetPhysicalDeviceExternalFencePropertiesKHR>(procAddr(instance, "vkGetPhysicalDeviceExternalFencePropertiesKHR"));
#endif
#if (defined(VK_KHR_device_group_creation))
        fp_vkEnumeratePhysicalDeviceGroupsKHR = reinterpret_cast<PFN_vkEnumeratePhysicalDeviceGroupsKHR>(procAddr(instance, "vkEnumeratePhysicalDeviceGroupsKHR"));
#endif
#if (defined(VK_EXT_calibrated_timestamps))
        fp_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT = reinterpret_cast<PFN_vkGetPhysicalDeviceCalibrateableTimeDomainsEXT>(procAddr(instance, "vkGetPhysicalDeviceCalibrateableTimeDomainsEXT"));
#endif
#if (defined(VK_EXT_tooling_info))
        fp_vkGetPhysicalDeviceToolPropertiesEXT = reinterpret_cast<PFN_vkGetPhysicalDeviceToolPropertiesEXT>(procAddr(instance, "vkGetPhysicalDeviceToolPropertiesEXT"));
#endif
    }